

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::serializeTo
          (TransRangeList *this,ASTSerializer *serializer)

{
  RepeatKind RVar1;
  size_t sVar2;
  pointer ppEVar3;
  size_t __n;
  long lVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  string_view name;
  
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar2 = (this->items)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppEVar3 = (this->items)._M_ptr;
    lVar4 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar3 + lVar4));
      lVar4 = lVar4 + 8;
    } while (sVar2 << 3 != lVar4);
  }
  ASTSerializer::endArray(serializer);
  if (this->repeatFrom != (Expression *)0x0) {
    ASTSerializer::write(serializer,10,"repeatFrom",(size_t)this->repeatFrom);
  }
  if (this->repeatTo != (Expression *)0x0) {
    ASTSerializer::write(serializer,8,"repeatTo",(size_t)this->repeatTo);
  }
  RVar1 = this->repeatKind;
  if (RVar1 == GoTo) {
    __n = 4;
  }
  else if (RVar1 == Nonconsecutive) {
    __n = 0xe;
  }
  else {
    if (RVar1 != Consecutive) {
      return;
    }
    __n = 0xb;
  }
  ASTSerializer::write(serializer,10,"repeatKind",__n);
  return;
}

Assistant:

void CoverageBinSymbol::TransRangeList::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("items");
    for (auto item : items)
        serializer.serialize(*item);
    serializer.endArray();

    if (repeatFrom)
        serializer.write("repeatFrom", *repeatFrom);
    if (repeatTo)
        serializer.write("repeatTo", *repeatTo);

    switch (repeatKind) {
        case Consecutive:
            serializer.write("repeatKind", "Consecutive"sv);
            break;
        case Nonconsecutive:
            serializer.write("repeatKind", "Nonconsecutive"sv);
            break;
        case GoTo:
            serializer.write("repeatKind", "GoTo"sv);
            break;
        default:
            break;
    }
}